

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_texshader.cpp
# Opt level: O1

FString __thiscall FTextureShader::CreateName(FTextureShader *this)

{
  long lVar1;
  long in_RSI;
  ulong uVar2;
  
  FString::FString((FString *)this,"custom");
  if (*(int *)(in_RSI + 0x14) != 0) {
    uVar2 = 0;
    do {
      lVar1 = *(long *)(*(long *)(in_RSI + 8) + uVar2 * 8);
      FString::AppendFormat
                ((FString *)this,"@%de%ds%ud%ut%dw%d",uVar2 & 0xffffffff,
                 (ulong)*(byte *)(lVar1 + 10),(ulong)*(uint *)(lVar1 + 0x178),
                 (ulong)*(uint *)(lVar1 + 0x17c),(ulong)*(byte *)(lVar1 + 0xb),
                 (ulong)*(byte *)(lVar1 + 8));
      uVar2 = uVar2 + 1;
    } while (uVar2 < *(uint *)(in_RSI + 0x14));
  }
  return (FString)(char *)this;
}

Assistant:

FString FTextureShader::CreateName()
{
	FString compose = "custom";
	for(unsigned i=0; i<layers.Size(); i++)
	{
		compose.AppendFormat("@%de%ds%ud%ut%dw%d", i, layers[i]->emissive, 
			layers[i]->blendFuncSrc, layers[i]->blendFuncDst, layers[i]->texgen, layers[i]->warp);
	}
	return compose;
}